

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonEachPathLength(JsonEachCursor *p)

{
  char cVar1;
  u32 i;
  u32 uVar2;
  u32 local_28;
  u32 uStack_24;
  char cSaved;
  u32 sz;
  u32 x;
  char *z;
  JsonEachCursor *pJStack_10;
  u32 n;
  JsonEachCursor *p_local;
  
  z._4_4_ = (uint)(p->path).nUsed;
  _sz = (p->path).zBuf;
  if (((p->iRowid == 0) && (p->bRecursive != '\0')) && (pJStack_10 = p, 1 < z._4_4_)) {
    do {
      do {
        if (z._4_4_ < 2) {
          return z._4_4_;
        }
        z._4_4_ = z._4_4_ - 1;
      } while ((_sz[z._4_4_] != '[') && (_sz[z._4_4_] != '.'));
      local_28 = 0;
      cVar1 = _sz[z._4_4_];
      _sz[z._4_4_] = '\0';
      i = jsonLookupStep(&pJStack_10->sParse,0,_sz + 1,0);
      _sz[z._4_4_] = cVar1;
      uStack_24 = i;
    } while ((0xfffffffc < i) ||
            (uVar2 = jsonbPayloadSize(&pJStack_10->sParse,i,&local_28), i + uVar2 != pJStack_10->i))
    ;
  }
  return z._4_4_;
}

Assistant:

static int jsonEachPathLength(JsonEachCursor *p){
  u32 n = p->path.nUsed;
  char *z = p->path.zBuf;
  if( p->iRowid==0 && p->bRecursive && n>=2 ){
    while( n>1 ){
      n--;
      if( z[n]=='[' || z[n]=='.' ){
        u32 x, sz = 0;
        char cSaved = z[n];
        z[n] = 0;
        assert( p->sParse.eEdit==0 );
        x = jsonLookupStep(&p->sParse, 0, z+1, 0);
        z[n] = cSaved;
        if( JSON_LOOKUP_ISERROR(x) ) continue;
        if( x + jsonbPayloadSize(&p->sParse, x, &sz) == p->i ) break;
      }
    }
  }
  return n;
}